

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<solitaire::archivers::interfaces::Snapshot_const&>>,std::tuple<solitaire::archivers::interfaces::Snapshot_const&>>
               (tuple<testing::Matcher<const_solitaire::archivers::interfaces::Snapshot_&>_>
                *matchers,tuple<const_solitaire::archivers::interfaces::Snapshot_&> *values,
               ostream *os)

{
  Snapshot *x;
  bool bVar1;
  ostream *poVar2;
  type matcher;
  StringMatchResultListener listener;
  MatcherBase<const_solitaire::archivers::interfaces::Snapshot_&> MStack_1e8;
  string local_1d0;
  StringMatchResultListener local_1b0;
  
  Matcher<const_solitaire::archivers::interfaces::Snapshot_&>::Matcher
            ((Matcher<const_solitaire::archivers::interfaces::Snapshot_&> *)&MStack_1e8,
             (Matcher<const_solitaire::archivers::interfaces::Snapshot_&> *)matchers);
  x = (values->super__Tuple_impl<0UL,_const_solitaire::archivers::interfaces::Snapshot_&>).
      super__Head_base<0UL,_const_solitaire::archivers::interfaces::Snapshot_&,_false>._M_head_impl;
  StringMatchResultListener::StringMatchResultListener(&local_1b0);
  bVar1 = MatcherBase<const_solitaire::archivers::interfaces::Snapshot_&>::MatchAndExplain
                    (&MStack_1e8,x,&local_1b0.super_MatchResultListener);
  if (!bVar1) {
    poVar2 = std::operator<<(os,"  Expected arg #");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,": ");
    MatcherBase<const_solitaire::archivers::interfaces::Snapshot_&>::DescribeTo
              ((MatcherBase<const_solitaire::archivers::interfaces::Snapshot_&> *)matchers,os);
    std::operator<<(os,"\n           Actual: ");
    RawBytesPrinter::PrintValue<solitaire::archivers::interfaces::Snapshot,8ul>(x,os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&local_1b0);
  MatcherBase<const_solitaire::archivers::interfaces::Snapshot_&>::~MatcherBase(&MStack_1e8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }